

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_advanced.c
# Opt level: O0

int light_section_feature_extraction
              (light_pcapng section,_func_int_light_pcapng_void_ptr_size_t *extractor,
              void **feature_vector,size_t feature_vector_size,light_feature_t type)

{
  light_boolean lVar1;
  void *pvVar2;
  size_t in_RCX;
  long *in_RDX;
  code *in_RSI;
  _light_pcapng *in_RDI;
  undefined4 in_R8D;
  bool bVar3;
  light_pcapng iterator;
  _light_pcapng *local_38;
  int local_4;
  
  lVar1 = __is_section_header(in_RDI);
  if (lVar1 == LIGHT_TRUE) {
    switch(in_R8D) {
    case 0:
      pvVar2 = calloc(1,8);
      *in_RDX = (long)pvVar2;
      break;
    case 1:
      pvVar2 = calloc(in_RCX,1);
      *in_RDX = (long)pvVar2;
      break;
    case 2:
      pvVar2 = calloc(in_RCX,2);
      *in_RDX = (long)pvVar2;
      break;
    case 4:
      pvVar2 = calloc(in_RCX,4);
      *in_RDX = (long)pvVar2;
      break;
    case 5:
      pvVar2 = calloc(in_RCX,8);
      *in_RDX = (long)pvVar2;
    }
    if (*in_RDX == 0) {
      local_4 = -2;
    }
    else {
      (*in_RSI)(in_RDI,*in_RDX,in_RCX);
      local_38 = in_RDI->next_block;
      while( true ) {
        bVar3 = false;
        if (local_38 != (_light_pcapng *)0x0) {
          lVar1 = __is_section_header(local_38);
          bVar3 = lVar1 != LIGHT_TRUE;
        }
        if (!bVar3) break;
        (*in_RSI)(local_38,*in_RDX,in_RCX);
        local_38 = local_38->next_block;
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int light_section_feature_extraction(const light_pcapng section, int (*extractor)(const light_pcapng, void *, size_t),
		void **feature_vector, const size_t feature_vector_size, const light_feature_t type)
{
	light_pcapng iterator;

	if (__is_section_header(section) != LIGHT_TRUE) {
		return LIGHT_INVALID_SECTION;
	}

	switch(type) {
	case LIGHT_FEATURE_BITMASK:
		*feature_vector = calloc(1, sizeof(uint64_t));
		break;
	case LIGHT_FEATURE_BYTE:
		*feature_vector = calloc(feature_vector_size, sizeof(uint8_t));
		break;
	case LIGHT_FEATURE_SHORT:
		*feature_vector = calloc(feature_vector_size, sizeof(uint16_t));
		break;
	case LIGHT_FEATURE_FLOAT:
		*feature_vector = calloc(feature_vector_size, sizeof(float));
		break;
	case LIGHT_FEATURE_DOUBLE:
		*feature_vector = calloc(feature_vector_size, sizeof(double));
		break;
	}

	if (*feature_vector == NULL) {
		return LIGHT_OUT_OF_MEMORY;
	}

	extractor(section, *feature_vector, feature_vector_size);
	iterator = section->next_block;
	while (iterator != NULL && __is_section_header(iterator) != LIGHT_TRUE) {
		extractor(iterator, *feature_vector, feature_vector_size);
		iterator = iterator->next_block;
	}

	return LIGHT_SUCCESS;
}